

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# publication.cpp
# Opt level: O2

void __thiscall
miniros::PeerConnDisconnCallback::PeerConnDisconnCallback
          (PeerConnDisconnCallback *this,SubscriberStatusCallback *callback,
          SubscriberLinkPtr *sub_link,bool use_tracked_object,VoidConstWPtr *tracked_object)

{
  (this->super_CallbackInterface)._vptr_CallbackInterface =
       (_func_int **)&PTR__PeerConnDisconnCallback_002f0fd8;
  std::function<void_(const_miniros::SingleSubscriberPublisher_&)>::function
            (&this->callback_,callback);
  std::__shared_ptr<miniros::SubscriberLink,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&(this->sub_link_).
              super___shared_ptr<miniros::SubscriberLink,_(__gnu_cxx::_Lock_policy)2>,
             &sub_link->super___shared_ptr<miniros::SubscriberLink,_(__gnu_cxx::_Lock_policy)2>);
  this->use_tracked_object_ = use_tracked_object;
  std::__weak_ptr<const_void,_(__gnu_cxx::_Lock_policy)2>::__weak_ptr
            (&(this->tracked_object_).super___weak_ptr<const_void,_(__gnu_cxx::_Lock_policy)2>,
             &tracked_object->super___weak_ptr<const_void,_(__gnu_cxx::_Lock_policy)2>);
  return;
}

Assistant:

PeerConnDisconnCallback(const SubscriberStatusCallback& callback, const SubscriberLinkPtr& sub_link, bool use_tracked_object, const VoidConstWPtr& tracked_object)
  : callback_(callback)
  , sub_link_(sub_link)
  , use_tracked_object_(use_tracked_object)
  , tracked_object_(tracked_object)
  {
  }